

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.hpp
# Opt level: O3

value_ptr pstore::dump::make_value<pstore::repo::fragment>(extent<pstore::repo::fragment> ex)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  typed_address<pstore::repo::fragment> tVar2;
  long lVar3;
  value_ptr vVar4;
  initializer_list<pstore::dump::object::member> __l;
  allocator_type local_109;
  value_ptr local_108;
  value_ptr local_f8;
  string local_e8;
  string local_c8;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_a8;
  member local_90;
  member local_60;
  
  tVar2 = ex.addr.a_.a_;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"addr","");
  local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015bac8;
  local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__address_0015c080;
  local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = (int)ex.size;
  local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = (int)(ex.size >> 0x20);
  *(undefined1 *)
   &local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [2]._vptr__Sp_counted_base = address::default_expanded_;
  local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0;
  local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count =
         (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  object::member::member(&local_90,&local_e8,&local_f8);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"size","");
  local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015b8d0;
  local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._M_use_count = number_base::default_base_;
  local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._vptr__Sp_counted_base = (_func_int **)&PTR__number_base_0015c618;
  local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
  ._vptr__Sp_counted_base = in_RDX;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count =
         (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  object::member::member(&local_60,&local_c8,&local_108);
  __l._M_len = 2;
  __l._M_array = &local_90;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_a8,__l,&local_109);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015b808;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__object_0015ca78;
  *(pointer *)&this_00[1]._M_use_count =
       local_a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this_00[2]._vptr__Sp_counted_base =
       (_func_int **)
       local_a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)&this_00[2]._M_use_count =
       local_a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)&this_00[3]._vptr__Sp_counted_base = 0;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_a8);
  lVar3 = 0;
  do {
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&local_60.val.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + lVar3);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    pcVar1 = *(char **)((long)&local_60.property._M_dataplus._M_p + lVar3);
    if (local_60.property.field_2._M_local_buf + lVar3 != pcVar1) {
      operator_delete(pcVar1,*(long *)((long)&local_60.property.field_2 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x60);
  if (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  *(undefined1 *)&this_00[3]._vptr__Sp_counted_base = 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)tVar2.a_.a_ = this_00 + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)tVar2.a_.a_ + 8) = this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  vVar4.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar4.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)tVar2.a_.a_;
  return (value_ptr)vVar4.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (extent<T> ex) {
            auto const v = std::make_shared<object> (object::container{
                {"addr", make_value (ex.addr)},
                {"size", make_value (ex.size)},
            });
            v->compact ();
            return std::static_pointer_cast<value> (v);
        }